

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  FILE *__stream;
  pthread_t arg;
  int contexts [2];
  int iVar2;
  uint uVar3;
  __uid_t _Var4;
  undefined8 uVar5;
  yoml_t *node;
  char *pcVar6;
  FILE *pFVar7;
  int *piVar8;
  char *pcVar9;
  anon_struct_968_4_e2476a95 *paVar10;
  ulong uVar11;
  FILE **__s;
  uint uVar12;
  undefined8 uStack_120;
  FILE *local_118;
  FILE *local_110;
  FILE *local_108;
  char *local_100;
  time_t local_f8;
  ulong local_f0;
  ulong local_e8;
  pthread_t local_e0;
  pthread_t tid;
  size_t i;
  int fds [2];
  anon_struct_24_3_c0c47172 ssl_contexts;
  size_t j;
  size_t i_3;
  FILE *fp;
  rlimit limit;
  size_t sStack_80;
  int all_were_bound;
  size_t i_2;
  yoml_parse_args_t parse_args;
  resolve_tag_arg_t resolve_tag_arg;
  yoml_t *yoml;
  size_t i_1;
  int ch;
  int error_log_fd;
  char *opt_config_file;
  char *cmd;
  char **argv_local;
  int argc_local;
  
  __s = &local_118;
  pcVar6 = *argv;
  _ch = "etc/h2o.conf";
  i_1._4_4_ = -1;
  uStack_120 = 0x20543b;
  conf.num_threads = h2o_numproc();
  conf.tfo_queues = 0x1000;
  uStack_120 = 0x205455;
  conf.launch_time = time((time_t *)0x0);
  h2o_hostinfo_max_threads = 0x20;
  uStack_120 = 0x20547b;
  h2o_sem_init(&ocsp_updater_semaphore,10);
  uStack_120 = 0x205480;
  init_openssl();
  uStack_120 = 0x205485;
  setup_configurators();
  while( true ) {
    uStack_120 = 0x2054a4;
    iVar2 = getopt_long(argc,argv,"c:m:tvh",main::longopts,0);
    if (iVar2 == -1) break;
    local_e8 = (ulong)(iVar2 - 0x3a);
    switch(local_e8) {
    case 0:
    case 5:
      uStack_120 = 0x20566b;
      exit(0x4e);
    default:
      uStack_120 = 0x20568a;
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/src/main.c",
                    0x802,"int main(int, char **)");
    case 0x29:
      _ch = _optarg;
      break;
    case 0x2e:
      uStack_120 = 0x20565a;
      printf("h2o version 2.2.5\n\nUsage:\n  h2o [options]\n\nOptions:\n  -c, --conf FILE    configuration file (default: %s)\n  -m, --mode <mode>  specifies one of the following mode\n                     - worker: invoked process handles incoming connections\n                               (default)\n                     - daemon: spawns a master process and exits. `error-log`\n                               must be configured when using this mode, as all\n                               the errors are logged to the file instead of\n                               being emitted to STDERR\n                     - master: invoked process becomes a master process (using\n                               the `share/h2o/start_server` command) and spawns\n                               a worker process for handling incoming\n                               connections. Users may send SIGHUP to the master\n                               process to reconfigure or upgrade the server.\n                     - test:   tests the configuration and exits\n  -t, --test         synonym of `--mode=test`\n  -v, --version      prints the version number\n  -h, --help         print this help\n\nPlease refer to the documentation under `share/doc/h2o` (or available online at\nhttp://h2o.examp1e.net/) for how to configure the server.\n\n"
             ,"etc/h2o.conf");
      uStack_120 = 0x205661;
      exit(0);
    case 0x33:
      uStack_120 = 0x205508;
      iVar2 = strcmp(_optarg,"worker");
      if (iVar2 == 0) {
        conf.run_mode = RUN_MODE_WORKER;
      }
      else {
        uStack_120 = 0x205532;
        iVar2 = strcmp(_optarg,"master");
        if (iVar2 == 0) {
          conf.run_mode = RUN_MODE_MASTER;
        }
        else {
          uStack_120 = 0x205559;
          iVar2 = strcmp(_optarg,"daemon");
          if (iVar2 == 0) {
            conf.run_mode = RUN_MODE_DAEMON;
          }
          else {
            uStack_120 = 0x205580;
            iVar2 = strcmp(_optarg,"test");
            if (iVar2 == 0) {
              conf.run_mode = RUN_MODE_TEST;
            }
            else {
              uStack_120 = 0x2055b3;
              fprintf(_stderr,"unknown mode:%s\n",_optarg);
            }
          }
        }
      }
      if (conf.run_mode == RUN_MODE_MASTER || conf.run_mode == RUN_MODE_DAEMON) {
        uStack_120 = 0x2055d4;
        pcVar9 = getenv("SERVER_STARTER_PORT");
        if (pcVar9 != (char *)0x0) {
          uStack_120 = 0x2055fc;
          fprintf(_stderr,
                  "refusing to start in `%s` mode, environment variable SERVER_STARTER_PORT is already set\n"
                  ,_optarg);
          uStack_120 = 0x205606;
          exit(0x46);
        }
      }
      break;
    case 0x3a:
      conf.run_mode = RUN_MODE_TEST;
      break;
    case 0x3c:
      uStack_120 = 0x205626;
      printf("h2o version 2.2.5\n");
      uStack_120 = 0x20562d;
      uVar5 = OpenSSL_version(0);
      uStack_120 = 0x20563e;
      printf("OpenSSL: %s\n",uVar5);
      uStack_120 = 0x205645;
      exit(0);
    }
  }
  uStack_120 = 0x2056ce;
  conf.server_starter.num_fds = h2o_server_starter_get_fds(&conf.server_starter.fds);
  if (conf.server_starter.num_fds == 0xffffffffffffffff) {
    uStack_120 = 0x2056e5;
    exit(0x4e);
  }
  if (conf.server_starter.fds != (int *)0x0) {
    for (yoml = (yoml_t *)0x0; yoml != (yoml_t *)conf.server_starter.num_fds;
        yoml = (yoml_t *)((long)&yoml->type + 1)) {
      uStack_120 = 0x205717;
      set_cloexec(conf.server_starter.fds[(long)yoml]);
    }
    lVar1 = -(conf.server_starter.num_fds + 0xf & 0xfffffffffffffff0);
    __s = (FILE **)((long)&local_118 + lVar1);
    *(undefined8 *)((long)&uStack_120 + lVar1) = 0x205759;
    conf.server_starter.bound_fd_map = (char *)__s;
    memset(__s,0,conf.server_starter.num_fds);
    *(undefined8 *)((long)&uStack_120 + lVar1) = 0x205765;
    conf.server_starter.env_var = getenv("SERVER_STARTER_PORT");
  }
  builtin_strncpy((char *)((long)__s + -8),"xW ",4);
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  unsetenv("SERVER_STARTER_PORT");
  *(char *)((long)__s + -8) = -0x78;
  *(char *)((long)__s + -7) = 'W';
  *(char *)((long)__s + -6) = ' ';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  memset(&parse_args.resolve_tag.cb_arg,0,0x18);
  i_2 = (size_t)_ch;
  parse_args.filename = (char *)0x0;
  parse_args.mem_set = resolve_tag;
  parse_args.resolve_tag.cb =
       (_func_yoml_t_ptr_char_ptr_yoml_t_ptr_void_ptr *)&parse_args.resolve_tag.cb_arg;
  *(char *)((long)__s + -8) = -0x48;
  *(char *)((long)__s + -7) = 'W';
  *(char *)((long)__s + -6) = ' ';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  node = load_config((yoml_parse_args_t *)&i_2,(yoml_t *)0x0);
  if (node == (yoml_t *)0x0) {
    *(char *)((long)__s + -8) = -0x34;
    *(char *)((long)__s + -7) = 'W';
    *(char *)((long)__s + -6) = ' ';
    *(char *)((long)__s + -5) = '\0';
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    exit(0x4e);
  }
  *(char *)((long)__s + -8) = -0x15;
  *(char *)((long)__s + -7) = 'W';
  *(char *)((long)__s + -6) = ' ';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  iVar2 = h2o_configurator_apply(&conf.globalconf,node,(uint)(conf.run_mode != RUN_MODE_WORKER));
  if (iVar2 != 0) {
    *(char *)((long)__s + -8) = -6;
    *(char *)((long)__s + -7) = 'W';
    *(char *)((long)__s + -6) = ' ';
    *(char *)((long)__s + -5) = '\0';
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    exit(0x4e);
  }
  builtin_strncpy((char *)((long)__s + -8),"\x03X ",4);
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  dispose_resolve_tag_arg((resolve_tag_arg_t *)&parse_args.resolve_tag.cb_arg);
  builtin_strncpy((char *)((long)__s + -8),"\x10X ",4);
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  yoml_free(node,(_func_void_ptr_void_ptr_int_size_t *)0x0);
  conf.globalconf.filecache.capacity =
       conf.globalconf.http2.max_concurrent_requests_per_connection << 1;
  if (conf.server_starter.fds != (int *)0x0) {
    limit.rlim_max._4_4_ = 1;
    for (sStack_80 = 0; sStack_80 != conf.server_starter.num_fds; sStack_80 = sStack_80 + 1) {
      if (conf.server_starter.bound_fd_map[sStack_80] == '\0') {
        uVar3 = conf.server_starter.fds[sStack_80];
        *(char *)((long)__s + -8) = -0x7e;
        *(char *)((long)__s + -7) = 'X';
        *(char *)((long)__s + -6) = ' ';
        *(char *)((long)__s + -5) = '\0';
        *(char *)((long)__s + -4) = '\0';
        *(char *)((long)__s + -3) = '\0';
        *(char *)((long)__s + -2) = '\0';
        *(char *)((long)__s + -1) = '\0';
        fprintf(_stderr,"no configuration found for fd:%d passed in by $SERVER_STARTER_PORT\n",
                (ulong)uVar3);
        limit.rlim_max._4_4_ = 0;
      }
    }
    if (limit.rlim_max._4_4_ == 0) {
      *(char *)((long)__s + -8) = -0x42;
      *(char *)((long)__s + -7) = 'X';
      *(char *)((long)__s + -6) = ' ';
      *(char *)((long)__s + -5) = '\0';
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      fprintf(_stderr,"note: $SERVER_STARTER_PORT was \"%s\"\n",conf.server_starter.env_var);
      return 0x4e;
    }
  }
  *(char *)((long)__s + -8) = -0x2b;
  *(char *)((long)__s + -7) = 'X';
  *(char *)((long)__s + -6) = ' ';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  local_f8 = time((time_t *)0x0);
  *(char *)((long)__s + -8) = -0x1f;
  *(char *)((long)__s + -7) = 'X';
  *(char *)((long)__s + -6) = ' ';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  uVar3 = getpid();
  uVar12 = (uint)local_f8;
  *(char *)((long)__s + -8) = -0xf;
  *(char *)((long)__s + -7) = 'X';
  *(char *)((long)__s + -6) = ' ';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  srand(uVar12 ^ uVar3);
  local_f0 = (ulong)conf.run_mode;
  switch(local_f0) {
  case 0:
  default:
    *(char *)((long)__s + -8) = -0x61;
    *(char *)((long)__s + -7) = 'Y';
    *(char *)((long)__s + -6) = ' ';
    *(char *)((long)__s + -5) = '\0';
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    pcVar6 = getenv("H2O_VIA_MASTER");
    if (pcVar6 != (char *)0x0) {
      conf.pid_file = (char *)0x0;
      conf.error_log = (char *)0x0;
    }
    *(char *)((long)__s + -8) = -0x34;
    *(char *)((long)__s + -7) = 'Y';
    *(char *)((long)__s + -6) = ' ';
    *(char *)((long)__s + -5) = '\0';
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    iVar2 = getrlimit(RLIMIT_NOFILE,(rlimit *)&fp);
    if (iVar2 == 0) {
      fp = (FILE *)limit.rlim_cur;
      *(char *)((long)__s + -8) = -0x10;
      *(char *)((long)__s + -7) = 'Y';
      *(char *)((long)__s + -6) = ' ';
      *(char *)((long)__s + -5) = '\0';
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      iVar2 = setrlimit(RLIMIT_NOFILE,(rlimit *)&fp);
      if (iVar2 == 0) {
        uVar11 = (ulong)fp & 0xffffffff;
        builtin_strncpy((char *)((long)__s + -8),"\x16Z ",4);
        *(char *)((long)__s + -4) = '\0';
        *(char *)((long)__s + -3) = '\0';
        *(char *)((long)__s + -2) = '\0';
        *(char *)((long)__s + -1) = '\0';
        fprintf(_stderr,"[INFO] raised RLIMIT_NOFILE to %d\n",uVar11);
      }
    }
    builtin_strncpy((char *)((long)__s + -8),"\x1dZ ",4);
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    setup_signal_handlers();
    if (conf.error_log != (char *)0x0) {
      builtin_strncpy((char *)((long)__s + -8),"3Z ",4);
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      i_1._4_4_ = h2o_access_log_open_log(conf.error_log);
      if (i_1._4_4_ == -1) {
        return 0x4e;
      }
    }
    builtin_strncpy((char *)((long)__s + -8),"dZ ",4);
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    setvbuf(_stdout,(char *)0x0,1,0);
    builtin_strncpy((char *)((long)__s + -8),"\x7fZ ",4);
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    setvbuf(_stderr,(char *)0x0,1,0);
    if (conf.globalconf.user == (char *)0x0) {
      builtin_strncpy((char *)((long)__s + -8),"\x14[ ",4);
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      _Var4 = getuid();
      if (_Var4 == 0) {
        builtin_strncpy((char *)((long)__s + -8),"1[ ",4);
        *(char *)((long)__s + -4) = '\0';
        *(char *)((long)__s + -3) = '\0';
        *(char *)((long)__s + -2) = '\0';
        *(char *)((long)__s + -1) = '\0';
        fprintf(_stderr,
                "refusing to run as root (and failed to switch to `nobody`); you can use the `user` directive to set the running user\n"
               );
        return 0x4e;
      }
    }
    else {
      *(char *)((long)__s + -8) = -0x67;
      *(char *)((long)__s + -7) = 'Z';
      *(char *)((long)__s + -6) = ' ';
      *(char *)((long)__s + -5) = '\0';
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      iVar2 = h2o_setuidgid(conf.globalconf.user);
      if (iVar2 != 0) {
        *(char *)((long)__s + -8) = -0x4a;
        *(char *)((long)__s + -7) = 'Z';
        *(char *)((long)__s + -6) = ' ';
        *(char *)((long)__s + -5) = '\0';
        *(char *)((long)__s + -4) = '\0';
        *(char *)((long)__s + -3) = '\0';
        *(char *)((long)__s + -2) = '\0';
        *(char *)((long)__s + -1) = '\0';
        fprintf(_stderr,
                "failed to change the running user (are you sure you are running as root?)\n");
        return 0x47;
      }
      if (neverbleed != (neverbleed_t *)0x0) {
        *(char *)((long)__s + -8) = -0x1c;
        *(char *)((long)__s + -7) = 'Z';
        *(char *)((long)__s + -6) = ' ';
        *(char *)((long)__s + -5) = '\0';
        *(char *)((long)__s + -4) = '\0';
        *(char *)((long)__s + -3) = '\0';
        *(char *)((long)__s + -2) = '\0';
        *(char *)((long)__s + -1) = '\0';
        iVar2 = neverbleed_setuidgid(neverbleed,conf.globalconf.user,1);
        if (iVar2 != 0) {
          builtin_strncpy((char *)((long)__s + -8),"\x01[ ",4);
          *(char *)((long)__s + -4) = '\0';
          *(char *)((long)__s + -3) = '\0';
          *(char *)((long)__s + -2) = '\0';
          *(char *)((long)__s + -1) = '\0';
          fprintf(_stderr,"failed to change the running user of neverbleed daemon\n");
          return 0x47;
        }
      }
    }
    if (conf.pid_file != (char *)0x0) {
      builtin_strncpy((char *)((long)__s + -8),"`[ ",4);
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      pFVar7 = fopen(conf.pid_file,"wt");
      if (pFVar7 == (FILE *)0x0) {
        local_108 = _stderr;
        local_100 = conf.pid_file;
        *(char *)((long)__s + -8) = -0x6b;
        *(char *)((long)__s + -7) = '[';
        *(char *)((long)__s + -6) = ' ';
        *(char *)((long)__s + -5) = '\0';
        *(char *)((long)__s + -4) = '\0';
        *(char *)((long)__s + -3) = '\0';
        *(char *)((long)__s + -2) = '\0';
        *(char *)((long)__s + -1) = '\0';
        piVar8 = __errno_location();
        iVar2 = *piVar8;
        *(char *)((long)__s + -8) = -100;
        *(char *)((long)__s + -7) = '[';
        *(char *)((long)__s + -6) = ' ';
        *(char *)((long)__s + -5) = '\0';
        *(char *)((long)__s + -4) = '\0';
        *(char *)((long)__s + -3) = '\0';
        *(char *)((long)__s + -2) = '\0';
        *(char *)((long)__s + -1) = '\0';
        pcVar9 = strerror(iVar2);
        pcVar6 = local_100;
        pFVar7 = local_108;
        *(char *)((long)__s + -8) = -0x45;
        *(char *)((long)__s + -7) = '[';
        *(char *)((long)__s + -6) = ' ';
        *(char *)((long)__s + -5) = '\0';
        *(char *)((long)__s + -4) = '\0';
        *(char *)((long)__s + -3) = '\0';
        *(char *)((long)__s + -2) = '\0';
        *(char *)((long)__s + -1) = '\0';
        fprintf(pFVar7,"failed to open pid file:%s:%s\n",pcVar6,pcVar9);
        return 0x47;
      }
      local_110 = pFVar7;
      *(char *)((long)__s + -8) = -0x26;
      *(char *)((long)__s + -7) = '[';
      *(char *)((long)__s + -6) = ' ';
      *(char *)((long)__s + -5) = '\0';
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      uVar3 = getpid();
      __stream = local_110;
      *(char *)((long)__s + -8) = -0xf;
      *(char *)((long)__s + -7) = '[';
      *(char *)((long)__s + -6) = ' ';
      *(char *)((long)__s + -5) = '\0';
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      fprintf(__stream,"%d\n",(ulong)uVar3);
      *(char *)((long)__s + -8) = -3;
      *(char *)((long)__s + -7) = '[';
      *(char *)((long)__s + -6) = ' ';
      *(char *)((long)__s + -5) = '\0';
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      fclose(pFVar7);
    }
    builtin_strncpy((char *)((long)__s + -8),"\x10\\ ",4);
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    memset(fds,0,0x18);
    for (j = 0; contexts = fds, j != conf.num_listeners; j = j + 1) {
      for (ssl_contexts.capacity = 0; ssl_contexts.capacity != (conf.listeners[j]->ssl).size;
          ssl_contexts.capacity = ssl_contexts.capacity + 1) {
        builtin_strncpy((char *)((long)__s + -8),"|\\ ",4);
        *(char *)((long)__s + -4) = '\0';
        *(char *)((long)__s + -3) = '\0';
        *(char *)((long)__s + -2) = '\0';
        *(char *)((long)__s + -1) = '\0';
        h2o_vector__reserve((h2o_mem_pool_t *)0x0,(h2o_vector_t *)fds,8,
                            (long)ssl_contexts.entries + 1);
        *(SSL_CTX **)((long)fds + (long)ssl_contexts.entries * 8) =
             (conf.listeners[j]->ssl).entries[ssl_contexts.capacity]->ctx;
        ssl_contexts.entries = (SSL_CTX **)((long)ssl_contexts.entries + 1);
      }
    }
    builtin_strncpy((char *)((long)__s + -8),"\a] ",4);
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    ssl_setup_session_resumption((SSL_CTX **)contexts,(size_t)ssl_contexts.entries);
    builtin_strncpy((char *)((long)__s + -8),"\x13] ",4);
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    free((void *)fds);
    builtin_strncpy((char *)((long)__s + -8),"\x1f] ",4);
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    iVar2 = pipe((int *)&i);
    if (iVar2 == 0) {
      builtin_strncpy((char *)((long)__s + -8),"G] ",4);
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      close(i._4_4_);
      iVar2 = (int)i;
      builtin_strncpy((char *)((long)__s + -8),"T] ",4);
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      dup2(iVar2,0);
      builtin_strncpy((char *)((long)__s + -8),"_] ",4);
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      close((int)i);
      if (i_1._4_4_ == -1) {
LAB_00205db0:
        local_118 = _stderr;
        *(char *)((long)__s + -8) = -0x3a;
        *(char *)((long)__s + -7) = ']';
        *(char *)((long)__s + -6) = ' ';
        *(char *)((long)__s + -5) = '\0';
        *(char *)((long)__s + -4) = '\0';
        *(char *)((long)__s + -3) = '\0';
        *(char *)((long)__s + -2) = '\0';
        *(char *)((long)__s + -1) = '\0';
        uVar3 = getpid();
        pFVar7 = local_118;
        *(char *)((long)__s + -8) = -0x23;
        *(char *)((long)__s + -7) = ']';
        *(char *)((long)__s + -6) = ' ';
        *(char *)((long)__s + -5) = '\0';
        *(char *)((long)__s + -4) = '\0';
        *(char *)((long)__s + -3) = '\0';
        *(char *)((long)__s + -2) = '\0';
        *(char *)((long)__s + -1) = '\0';
        fprintf(pFVar7,"h2o server (pid:%d) is ready to serve requests\n",(ulong)uVar3);
        if (conf.num_threads == 0) {
          builtin_strncpy((char *)((long)__s + -8),"\b^ ",4);
          *(char *)((long)__s + -4) = '\0';
          *(char *)((long)__s + -3) = '\0';
          *(char *)((long)__s + -2) = '\0';
          *(char *)((long)__s + -1) = '\0';
          __assert_fail("conf.num_threads != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/src/main.c"
                        ,0x8af,"int main(int, char **)");
        }
        paVar10 = (anon_struct_968_4_e2476a95 *)
                  ((long)__s + -(conf.num_threads * 0x3c8 + 0xf & 0xfffffffffffffff0));
        paVar10[-1].memcached.cb = (h2o_multithread_receiver_cb)0x205e48;
        conf.threads = paVar10;
        h2o_barrier_init(&conf.startup_sync_barrier,conf.num_threads);
        for (tid = 1; arg = tid, tid != conf.num_threads; tid = tid + 1) {
          paVar10[-1].memcached.cb = (h2o_multithread_receiver_cb)0x205e81;
          h2o_multithread_create_thread(&local_e0,(pthread_attr_t *)0x0,run_loop,(void *)arg);
        }
        paVar10[-1].memcached.cb = (h2o_multithread_receiver_cb)0x205e9e;
        run_loop((void *)0x0);
      }
      builtin_strncpy((char *)((long)__s + -8),"r] ",4);
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      iVar2 = dup2(i_1._4_4_,1);
      if (iVar2 != -1) {
        *(char *)((long)__s + -8) = -0x7c;
        *(char *)((long)__s + -7) = ']';
        *(char *)((long)__s + -6) = ' ';
        *(char *)((long)__s + -5) = '\0';
        *(char *)((long)__s + -4) = '\0';
        *(char *)((long)__s + -3) = '\0';
        *(char *)((long)__s + -2) = '\0';
        *(char *)((long)__s + -1) = '\0';
        iVar2 = dup2(i_1._4_4_,2);
        if (iVar2 != -1) {
          *(char *)((long)__s + -8) = -0x57;
          *(char *)((long)__s + -7) = ']';
          *(char *)((long)__s + -6) = ' ';
          *(char *)((long)__s + -5) = '\0';
          *(char *)((long)__s + -4) = '\0';
          *(char *)((long)__s + -3) = '\0';
          *(char *)((long)__s + -2) = '\0';
          *(char *)((long)__s + -1) = '\0';
          close(i_1._4_4_);
          goto LAB_00205db0;
        }
      }
      *(char *)((long)__s + -8) = -0x6b;
      *(char *)((long)__s + -7) = ']';
      *(char *)((long)__s + -6) = ' ';
      *(char *)((long)__s + -5) = '\0';
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      perror("dup(2) failed");
      argv_local._4_4_ = 0x47;
    }
    else {
      builtin_strncpy((char *)((long)__s + -8),"0] ",4);
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      perror("pipe failed");
      argv_local._4_4_ = 0x47;
    }
    break;
  case 1:
    builtin_strncpy((char *)((long)__s + -8),"qY ",4);
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    argv_local._4_4_ = run_using_server_starter(pcVar6,_ch);
    break;
  case 2:
    if (conf.error_log == (char *)0x0) {
      builtin_strncpy((char *)((long)__s + -8),"CY ",4);
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      fprintf(_stderr,
              "to run in `daemon` mode, `error-log` must be specified in the configuration file\n");
      argv_local._4_4_ = 0x4e;
    }
    else {
      builtin_strncpy((char *)((long)__s + -8),"\\Y ",4);
      *(char *)((long)__s + -4) = '\0';
      *(char *)((long)__s + -3) = '\0';
      *(char *)((long)__s + -2) = '\0';
      *(char *)((long)__s + -1) = '\0';
      argv_local._4_4_ = run_using_server_starter(pcVar6,_ch);
    }
    break;
  case 3:
    *(char *)((long)__s + -8) = -0x79;
    *(char *)((long)__s + -7) = 'Y';
    *(char *)((long)__s + -6) = ' ';
    *(char *)((long)__s + -5) = '\0';
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    printf("configuration OK\n");
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    const char *cmd = argv[0], *opt_config_file = H2O_TO_STR(H2O_CONFIG_PATH);
    int error_log_fd = -1;

    conf.num_threads = h2o_numproc();
    conf.tfo_queues = H2O_DEFAULT_LENGTH_TCP_FASTOPEN_QUEUE;
    conf.launch_time = time(NULL);

    h2o_hostinfo_max_threads = H2O_DEFAULT_NUM_NAME_RESOLUTION_THREADS;

    h2o_sem_init(&ocsp_updater_semaphore, H2O_DEFAULT_OCSP_UPDATER_MAX_THREADS);

    init_openssl();
    setup_configurators();

    { /* parse options */
        int ch;
        static struct option longopts[] = {{"conf", required_argument, NULL, 'c'}, {"mode", required_argument, NULL, 'm'},
                                           {"test", no_argument, NULL, 't'},       {"version", no_argument, NULL, 'v'},
                                           {"help", no_argument, NULL, 'h'},       {NULL}};
        while ((ch = getopt_long(argc, argv, "c:m:tvh", longopts, NULL)) != -1) {
            switch (ch) {
            case 'c':
                opt_config_file = optarg;
                break;
            case 'm':
                if (strcmp(optarg, "worker") == 0) {
                    conf.run_mode = RUN_MODE_WORKER;
                } else if (strcmp(optarg, "master") == 0) {
                    conf.run_mode = RUN_MODE_MASTER;
                } else if (strcmp(optarg, "daemon") == 0) {
                    conf.run_mode = RUN_MODE_DAEMON;
                } else if (strcmp(optarg, "test") == 0) {
                    conf.run_mode = RUN_MODE_TEST;
                } else {
                    fprintf(stderr, "unknown mode:%s\n", optarg);
                }
                switch (conf.run_mode) {
                case RUN_MODE_MASTER:
                case RUN_MODE_DAEMON:
                    if (getenv("SERVER_STARTER_PORT") != NULL) {
                        fprintf(stderr, "refusing to start in `%s` mode, environment variable SERVER_STARTER_PORT is already set\n",
                                optarg);
                        exit(EX_SOFTWARE);
                    }
                    break;
                default:
                    break;
                }
                break;
            case 't':
                conf.run_mode = RUN_MODE_TEST;
                break;
            case 'v':
                printf("h2o version " H2O_VERSION "\n");
                printf("OpenSSL: %s\n", SSLeay_version(SSLEAY_VERSION));
#if H2O_USE_MRUBY
                printf(
                    "mruby: YES\n"); /* TODO determine the way to obtain the version of mruby (that is being linked dynamically) */
#endif
                exit(0);
            case 'h':
                printf("h2o version " H2O_VERSION "\n"
                       "\n"
                       "Usage:\n"
                       "  h2o [options]\n"
                       "\n"
                       "Options:\n"
                       "  -c, --conf FILE    configuration file (default: %s)\n"
                       "  -m, --mode <mode>  specifies one of the following mode\n"
                       "                     - worker: invoked process handles incoming connections\n"
                       "                               (default)\n"
                       "                     - daemon: spawns a master process and exits. `error-log`\n"
                       "                               must be configured when using this mode, as all\n"
                       "                               the errors are logged to the file instead of\n"
                       "                               being emitted to STDERR\n"
                       "                     - master: invoked process becomes a master process (using\n"
                       "                               the `share/h2o/start_server` command) and spawns\n"
                       "                               a worker process for handling incoming\n"
                       "                               connections. Users may send SIGHUP to the master\n"
                       "                               process to reconfigure or upgrade the server.\n"
                       "                     - test:   tests the configuration and exits\n"
                       "  -t, --test         synonym of `--mode=test`\n"
                       "  -v, --version      prints the version number\n"
                       "  -h, --help         print this help\n"
                       "\n"
                       "Please refer to the documentation under `share/doc/h2o` (or available online at\n"
                       "http://h2o.examp1e.net/) for how to configure the server.\n"
                       "\n",
                       H2O_TO_STR(H2O_CONFIG_PATH));
                exit(0);
                break;
            case ':':
            case '?':
                exit(EX_CONFIG);
            default:
                assert(0);
                break;
            }
        }
        argc -= optind;
        argv += optind;
    }

    /* setup conf.server_starter */
    if ((conf.server_starter.num_fds = h2o_server_starter_get_fds(&conf.server_starter.fds)) == SIZE_MAX)
        exit(EX_CONFIG);
    if (conf.server_starter.fds != 0) {
        size_t i;
        for (i = 0; i != conf.server_starter.num_fds; ++i)
            set_cloexec(conf.server_starter.fds[i]);
        conf.server_starter.bound_fd_map = alloca(conf.server_starter.num_fds);
        memset(conf.server_starter.bound_fd_map, 0, conf.server_starter.num_fds);
        conf.server_starter.env_var = getenv("SERVER_STARTER_PORT");
    }
    unsetenv("SERVER_STARTER_PORT");

    { /* configure */
        yoml_t *yoml;
        resolve_tag_arg_t resolve_tag_arg = {{NULL}};
        yoml_parse_args_t parse_args = {
            opt_config_file,                /* filename */
            NULL,                           /* mem_set */
            {resolve_tag, &resolve_tag_arg} /* resolve_tag */
        };
        if ((yoml = load_config(&parse_args, NULL)) == NULL)
            exit(EX_CONFIG);
        if (h2o_configurator_apply(&conf.globalconf, yoml, conf.run_mode != RUN_MODE_WORKER) != 0)
            exit(EX_CONFIG);

        dispose_resolve_tag_arg(&resolve_tag_arg);
        yoml_free(yoml, NULL);
    }
    /* calculate defaults (note: open file cached is purged once every loop) */
    conf.globalconf.filecache.capacity = conf.globalconf.http2.max_concurrent_requests_per_connection * 2;

    /* check if all the fds passed in by server::starter were bound */
    if (conf.server_starter.fds != NULL) {
        size_t i;
        int all_were_bound = 1;
        for (i = 0; i != conf.server_starter.num_fds; ++i) {
            if (!conf.server_starter.bound_fd_map[i]) {
                fprintf(stderr, "no configuration found for fd:%d passed in by $SERVER_STARTER_PORT\n", conf.server_starter.fds[i]);
                all_were_bound = 0;
            }
        }
        if (!all_were_bound) {
            fprintf(stderr, "note: $SERVER_STARTER_PORT was \"%s\"\n", conf.server_starter.env_var);
            return EX_CONFIG;
        }
    }

    h2o_srand();
    /* handle run_mode == MASTER|TEST */
    switch (conf.run_mode) {
    case RUN_MODE_WORKER:
        break;
    case RUN_MODE_DAEMON:
        if (conf.error_log == NULL) {
            fprintf(stderr, "to run in `daemon` mode, `error-log` must be specified in the configuration file\n");
            return EX_CONFIG;
        }
        return run_using_server_starter(cmd, opt_config_file);
    case RUN_MODE_MASTER:
        return run_using_server_starter(cmd, opt_config_file);
    case RUN_MODE_TEST:
        printf("configuration OK\n");
        return 0;
    }

    if (getenv("H2O_VIA_MASTER") != NULL) {
        /* pid_file and error_log are the directives that are handled by the master process (invoking start_server) */
        conf.pid_file = NULL;
        conf.error_log = NULL;
    }

    { /* raise RLIMIT_NOFILE */
        struct rlimit limit;
        if (getrlimit(RLIMIT_NOFILE, &limit) == 0) {
            limit.rlim_cur = limit.rlim_max;
            if (setrlimit(RLIMIT_NOFILE, &limit) == 0
#ifdef __APPLE__
                || (limit.rlim_cur = OPEN_MAX, setrlimit(RLIMIT_NOFILE, &limit)) == 0
#endif
                ) {
                fprintf(stderr, "[INFO] raised RLIMIT_NOFILE to %d\n", (int)limit.rlim_cur);
            }
        }
    }

    setup_signal_handlers();

    /* open the log file to redirect STDIN/STDERR to, before calling setuid */
    if (conf.error_log != NULL) {
        if ((error_log_fd = h2o_access_log_open_log(conf.error_log)) == -1)
            return EX_CONFIG;
    }
    setvbuf(stdout, NULL, _IOLBF, 0);
    setvbuf(stderr, NULL, _IOLBF, 0);

    /* setuid */
    if (conf.globalconf.user != NULL) {
        if (h2o_setuidgid(conf.globalconf.user) != 0) {
            fprintf(stderr, "failed to change the running user (are you sure you are running as root?)\n");
            return EX_OSERR;
        }
        if (neverbleed != NULL && neverbleed_setuidgid(neverbleed, conf.globalconf.user, 1) != 0) {
            fprintf(stderr, "failed to change the running user of neverbleed daemon\n");
            return EX_OSERR;
        }
    } else {
        if (getuid() == 0) {
            fprintf(stderr, "refusing to run as root (and failed to switch to `nobody`); you can use the `user` directive to set "
                            "the running user\n");
            return EX_CONFIG;
        }
    }

    /* pid file must be written after setuid, since we need to remove it  */
    if (conf.pid_file != NULL) {
        FILE *fp = fopen(conf.pid_file, "wt");
        if (fp == NULL) {
            fprintf(stderr, "failed to open pid file:%s:%s\n", conf.pid_file, strerror(errno));
            return EX_OSERR;
        }
        fprintf(fp, "%d\n", (int)getpid());
        fclose(fp);
    }

    { /* initialize SSL_CTXs for session resumption and ticket-based resumption (also starts memcached client threads for the
         purpose) */
        size_t i, j;
        H2O_VECTOR(SSL_CTX *) ssl_contexts = {NULL};
        for (i = 0; i != conf.num_listeners; ++i) {
            for (j = 0; j != conf.listeners[i]->ssl.size; ++j) {
                h2o_vector_reserve(NULL, &ssl_contexts, ssl_contexts.size + 1);
                ssl_contexts.entries[ssl_contexts.size++] = conf.listeners[i]->ssl.entries[j]->ctx;
            }
        }
        ssl_setup_session_resumption(ssl_contexts.entries, ssl_contexts.size);
        free(ssl_contexts.entries);
    }

    /* all setup should be complete by now */

    /* replace STDIN to an closed pipe */
    {
        int fds[2];
        if (pipe(fds) != 0) {
            perror("pipe failed");
            return EX_OSERR;
        }
        close(fds[1]);
        dup2(fds[0], 0);
        close(fds[0]);
    }

    /* redirect STDOUT and STDERR to error_log (if specified) */
    if (error_log_fd != -1) {
        if (dup2(error_log_fd, 1) == -1 || dup2(error_log_fd, 2) == -1) {
            perror("dup(2) failed");
            return EX_OSERR;
        }
        close(error_log_fd);
        error_log_fd = -1;
    }

    fprintf(stderr, "h2o server (pid:%d) is ready to serve requests\n", (int)getpid());

    assert(conf.num_threads != 0);

    /* start the threads */
    conf.threads = alloca(sizeof(conf.threads[0]) * conf.num_threads);
    h2o_barrier_init(&conf.startup_sync_barrier, conf.num_threads);
    size_t i;
    for (i = 1; i != conf.num_threads; ++i) {
        pthread_t tid;
        h2o_multithread_create_thread(&tid, NULL, run_loop, (void *)i);
    }

    /* this thread becomes the first thread */
    run_loop((void *)0);

    /* notreached */
    return 0;
}